

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::RegisterProcessForMonitoring
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CSynchData *psdSynchData,
          CProcProcessLocalData *pProcLocalData)

{
  PAL_ERROR PVar1;
  MonitoredProcessesListNode *pMVar2;
  int *piVar3;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  pMVar2 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
  while (pMVar2 = pMVar2->pNext, pMVar2 != (MonitoredProcessesListNode *)0x0) {
    if (pMVar2->psdSynchData == psdSynchData) {
      if (pMVar2->dwPid != *(DWORD *)pProcLocalData) {
        fprintf(_stderr,"] %s %s:%d","RegisterProcessForMonitoring",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xb72);
        fprintf(_stderr,
                "Expression: pmpln->dwPid == pProcLocalData->dwProcessId, Description: Invalid node in Monitored Processes List\n"
               );
      }
      pMVar2->lRefCount = pMVar2->lRefCount + 1;
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      return 0;
    }
  }
  pMVar2 = (MonitoredProcessesListNode *)InternalMalloc(0x30);
  if (pMVar2 == (MonitoredProcessesListNode *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      return 8;
    }
  }
  else {
    pMVar2->pNext = (_MonitoredProcessesListNode *)0x0;
    *(undefined8 *)&pMVar2->lRefCount = 0;
    *(undefined8 *)&pMVar2->fIsActualExitCode = 0;
    pMVar2->pProcLocalData = (CProcProcessLocalData *)0x0;
    pMVar2->psdSynchData = (CSynchData *)0x0;
    pMVar2->dwPid = 0;
    pMVar2->dwExitCode = 0;
    pMVar2->lRefCount = 1;
    pMVar2->dwPid = *(DWORD *)pProcLocalData;
    pMVar2->pProcLocalData = pProcLocalData;
    pMVar2->psdSynchData = psdSynchData;
    LOCK();
    psdSynchData->m_lRefCount = psdSynchData->m_lRefCount + 1;
    UNLOCK();
    pMVar2->pNext = this->m_pmplnMonitoredProcesses;
    this->m_pmplnMonitoredProcesses = pMVar2;
    this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + 1;
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    PVar1 = WakeUpLocalWorkerThread(s_pObjSynchMgr,SynchWorkerCmdNop);
    if (PVar1 == 0) {
      return 0;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar3 = __errno_location();
      strerror(*piVar3);
      return 0x54f;
    }
  }
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::RegisterProcessForMonitoring(
        CPalThread * pthrCurrent,
        CSynchData *psdSynchData,
        CProcProcessLocalData * pProcLocalData)
    {
        PAL_ERROR palErr = NO_ERROR;
        MonitoredProcessesListNode * pmpln;
        bool fWakeUpWorker = false;
        bool fMonitoredProcessesLock = false;

        VALIDATEOBJECT(psdSynchData);

        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        pmpln = m_pmplnMonitoredProcesses;
        while (pmpln)
        {
            if (psdSynchData == pmpln->psdSynchData)
            {
                _ASSERT_MSG(pmpln->dwPid == pProcLocalData->dwProcessId,
                            "Invalid node in Monitored Processes List\n");
                break;
            }

            pmpln = pmpln->pNext;
        }

        if (pmpln)
        {
            pmpln->lRefCount++;
        }
        else
        {
            pmpln = InternalNew<MonitoredProcessesListNode>();
            if (NULL == pmpln)
            {
                ERROR("No memory to allocate MonitoredProcessesListNode structure\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto RPFM_exit;
            }

            pmpln->lRefCount      = 1;
            pmpln->dwPid          = pProcLocalData->dwProcessId;
            pmpln->dwExitCode     = 0;
            pmpln->pProcLocalData = pProcLocalData;

            // Acquire SynchData and AddRef it
            pmpln->psdSynchData = psdSynchData;
            psdSynchData->AddRef();

            pmpln->pNext = m_pmplnMonitoredProcesses;
            m_pmplnMonitoredProcesses = pmpln;
            m_lMonitoredProcessesCount++;

            fWakeUpWorker = true;
        }
        // Unlock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (fWakeUpWorker)
        {
            CPalSynchronizationManager * pSynchManager = GetInstance();

            palErr = pSynchManager->WakeUpLocalWorkerThread(SynchWorkerCmdNop);
            if (NO_ERROR != palErr)
            {
                ERROR("Failed waking up worker thread for process "
                      "monitoring registration [errno=%d {%s%}]\n",
                      errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
            }
        }

    RPFM_exit:
        if (fMonitoredProcessesLock)
        {
            InternalLeaveCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
        }
        return palErr;
    }